

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong *__ptr;
  long lVar6;
  ulong *puVar7;
  char *format;
  uint uVar8;
  _GLFWwindow *window;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  if (_glfw.initialized == 0) {
    iVar10 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (count < 0) {
      format = "Invalid image count for window icon";
    }
    else {
      lVar6 = 0;
      do {
        if ((ulong)(uint)count * 0x10 + 0x10 == lVar6 + 0x10) {
          if (count == 0) {
            XDeleteProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON)
            ;
          }
          else {
            uVar5 = 0;
            uVar11 = (ulong)(uint)count;
            if (count < 1) {
              uVar11 = uVar5;
            }
            iVar10 = 0;
            for (; uVar11 << 4 != uVar5; uVar5 = uVar5 + 0x10) {
              iVar10 = iVar10 + *(int *)((long)&images->height + uVar5) *
                                *(int *)((long)&images->width + uVar5) + 2;
            }
            __ptr = (ulong *)calloc((long)iVar10,8);
            puVar7 = __ptr;
            for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
              iVar2 = images[uVar5].width;
              *puVar7 = (long)iVar2;
              iVar3 = images[uVar5].height;
              puVar7[1] = (long)iVar3;
              puVar7 = puVar7 + 2;
              uVar8 = iVar3 * iVar2;
              if ((int)uVar8 < 1) {
                uVar8 = 0;
              }
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                puVar4 = images[uVar5].pixels;
                *puVar7 = (ulong)puVar4[uVar9 * 4 + 3] << 0x18 |
                          (ulong)puVar4[uVar9 * 4 + 2] |
                          (ulong)((uint)puVar4[uVar9 * 4 + 1] << 8 | (uint)puVar4[uVar9 * 4] << 0x10
                                 );
                puVar7 = puVar7 + 1;
              }
            }
            XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON,
                            6,0x20,0,__ptr,iVar10);
            free(__ptr);
          }
          XFlush(_glfw.x11.display);
          return;
        }
      } while ((0 < *(int *)((long)&images->width + lVar6)) &&
              (piVar1 = (int *)((long)&images->height + lVar6), lVar6 = lVar6 + 0x10, 0 < *piVar1));
      format = "Invalid image dimensions for window icon";
    }
    iVar10 = 0x10004;
  }
  _glfwInputError(iVar10,format);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    int i;
    _GLFWwindow* window = (_GLFWwindow*) handle;

    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();

    if (count < 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image count for window icon");
        return;
    }

    for (i = 0; i < count; i++)
    {
        assert(images[i].pixels != NULL);

        if (images[i].width <= 0 || images[i].height <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid image dimensions for window icon");
            return;
        }
    }

    _glfwPlatformSetWindowIcon(window, count, images);
}